

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

U32 ZSTD_resolveRepcodeToRawOffset(U32 *rep,U32 offBase,U32 ll0)

{
  uint uVar1;
  U32 adjustedRepCode;
  U32 ll0_local;
  U32 offBase_local;
  U32 *rep_local;
  
  if ((offBase == 0) || (3 < offBase)) {
    __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xf28,"U32 ZSTD_resolveRepcodeToRawOffset(const U32 *, const U32, const U32)");
  }
  uVar1 = (offBase - 1) + ll0;
  if ((offBase != 0) && (offBase < 4)) {
    if (uVar1 == 3) {
      if (ll0 == 0) {
        __assert_fail("ll0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0xf2b,"U32 ZSTD_resolveRepcodeToRawOffset(const U32 *, const U32, const U32)"
                     );
      }
      rep_local._4_4_ = *rep - 1;
    }
    else {
      rep_local._4_4_ = rep[uVar1];
    }
    return rep_local._4_4_;
  }
  __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0xf29,"U32 ZSTD_resolveRepcodeToRawOffset(const U32 *, const U32, const U32)");
}

Assistant:

static U32
ZSTD_resolveRepcodeToRawOffset(const U32 rep[ZSTD_REP_NUM], const U32 offBase, const U32 ll0)
{
    U32 const adjustedRepCode = OFFBASE_TO_REPCODE(offBase) - 1 + ll0;  /* [ 0 - 3 ] */
    assert(OFFBASE_IS_REPCODE(offBase));
    if (adjustedRepCode == ZSTD_REP_NUM) {
        assert(ll0);
        /* litlength == 0 and offCode == 2 implies selection of first repcode - 1
         * This is only valid if it results in a valid offset value, aka > 0.
         * Note : it may happen that `rep[0]==1` in exceptional circumstances.
         * In which case this function will return 0, which is an invalid offset.
         * It's not an issue though, since this value will be
         * compared and discarded within ZSTD_seqStore_resolveOffCodes().
         */
        return rep[0] - 1;
    }
    return rep[adjustedRepCode];
}